

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O0

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Mat *in_RSI;
  long in_RDI;
  int i_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size;
  int h_1;
  int w_2;
  int j;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int h;
  int w_1;
  int i;
  float *ptr;
  int w;
  int dims;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff28;
  int local_c0;
  Mat local_a8;
  Mat *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  float local_48;
  float local_44;
  float *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  float *local_28;
  int local_20;
  int local_1c;
  Mat *local_10;
  
  local_1c = in_RSI->dims;
  local_10 = in_RSI;
  if (local_1c == 1) {
    local_20 = in_RSI->w;
    local_28 = Mat::operator_cast_to_float_(in_RSI);
    for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x1c8),local_2c);
      fVar1 = *pfVar3;
      fVar2 = local_28[local_2c];
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x188),local_2c);
      local_28[local_2c] = fVar1 * fVar2 + *pfVar3;
    }
  }
  if (local_1c == 2) {
    local_30 = local_10->w;
    local_34 = local_10->h;
    for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
      local_40 = Mat::row(local_10,local_38);
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x188),local_38);
      local_44 = *pfVar3;
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x1c8),local_38);
      local_48 = *pfVar3;
      for (local_4c = 0; local_4c < local_30; local_4c = local_4c + 1) {
        local_40[local_4c] = local_48 * local_40[local_4c] + local_44;
      }
    }
  }
  if (local_1c == 3) {
    local_50 = local_10->w;
    local_54 = local_10->h;
    local_58 = local_50 * local_54;
    for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x80); local_5c = local_5c + 1) {
      this_00 = &local_a8;
      Mat::channel(in_stack_ffffffffffffff28,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff28 = (Mat *)Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x132d67);
      local_68 = in_stack_ffffffffffffff28;
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x188),local_5c);
      fVar1 = *pfVar3;
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x1c8),local_5c);
      fVar2 = *pfVar3;
      for (local_c0 = 0; local_c0 < local_58; local_c0 = local_c0 + 1) {
        *(float *)((long)&local_68->data + (long)local_c0 * 4) =
             fVar2 * *(float *)((long)&local_68->data + (long)local_c0 * 4) + fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j=0; j<w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i=0; i<size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}